

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar1 = 0x1f;
  do {
    if (uVar1 < 8) {
      uVar1 = 7;
      do {
        if ((int)uVar1 < 0) {
          return;
        }
        uVar2 = (ulong)uVar1;
        uVar4 = (ulong)uVar1;
        uVar1 = uVar1 - 1;
      } while (wnaf[uVar2] == wnaf_expected[uVar4]);
      pcVar5 = "test condition failed: wnaf[i] == wnaf_expected[i]";
      uVar3 = 0x14a5;
      goto LAB_00136888;
    }
    uVar2 = (ulong)uVar1;
    uVar1 = uVar1 - 1;
  } while (wnaf[uVar2] == 0);
  pcVar5 = "test condition failed: wnaf[i] == 0";
  uVar3 = 0x14a2;
LAB_00136888:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar3,pcVar5);
  abort();
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}